

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_9ab804::HandleSetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  const_reference pvVar6;
  cmMakefile *this;
  string local_148;
  string_view local_128;
  cmCMakePath local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  cmCMakePath path;
  string local_a0;
  byte local_7a;
  allocator<char> local_79;
  undefined1 local_78 [6];
  NormalizeOption arguments;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (2 < sVar3) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (sVar3 < 5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,1);
      uVar4 = std::__cxx11::string::empty();
      pcVar1 = local_20;
      if ((uVar4 & 1) == 0) {
        if ((anonymous_namespace)::
            HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
            ::parser == '\0') {
          iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                       ::parser);
          if (iVar2 != 0) {
            NormalizeParser::NormalizeParser(&HandleSetCommand::parser);
            __cxa_atexit(NormalizeParser::~NormalizeParser,&HandleSetCommand::parser,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 HandleSetCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
          }
        }
        local_7a = (byte)CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::Parse<2>
                                   (&HandleSetCommand::parser.
                                     super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>
                                    ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)status_local);
        pvVar5 = (anonymous_namespace)::
                 CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                 GetInputs_abi_cxx11_
                           ((CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                            &HandleSetCommand::parser);
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvVar5);
        pcVar1 = local_20;
        if (sVar3 == 1) {
          pvVar5 = (anonymous_namespace)::
                   CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                   GetInputs_abi_cxx11_
                             ((CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                              &HandleSetCommand::parser);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::front(pvVar5);
          std::__cxx11::string::string((string *)&local_f0,(string *)pvVar6);
          cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                    ((cmCMakePath *)local_d0,&local_f0,native_format);
          std::__cxx11::string::~string((string *)&local_f0);
          if ((local_7a & 1) != 0) {
            cmCMakePath::Normal(&local_118,(cmCMakePath *)local_d0);
            cmCMakePath::operator=((cmCMakePath *)local_d0,&local_118);
            cmCMakePath::~cmCMakePath(&local_118);
          }
          this = cmExecutionStatus::GetMakefile(local_20);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,1);
          cmCMakePath::GenericString_abi_cxx11_(&local_148,(cmCMakePath *)local_d0);
          local_128 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_148)
          ;
          cmMakefile::AddDefinition(this,pvVar6,local_128);
          std::__cxx11::string::~string((string *)&local_148);
          args_local._7_1_ = 1;
          cmCMakePath::~cmCMakePath((cmCMakePath *)local_d0);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"SET called with unexpected arguments.",
                     (allocator<char> *)
                     ((long)&path.Path._M_cmpts._M_impl._M_t.
                             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                             ._M_t + 7));
          cmExecutionStatus::SetError(pcVar1,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&path.Path._M_cmpts._M_impl._M_t.
                             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                             ._M_t + 7));
          args_local._7_1_ = 0;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_78,"Invalid name for path variable.",&local_79);
        cmExecutionStatus::SetError(pcVar1,(string *)local_78);
        std::__cxx11::string::~string((string *)local_78);
        std::allocator<char>::~allocator(&local_79);
        args_local._7_1_ = 0;
      }
      goto LAB_00576d7d;
    }
  }
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"SET must be called with two or three arguments.",&local_41);
  cmExecutionStatus::SetError(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  args_local._7_1_ = 0;
LAB_00576d7d:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleSetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 3 || args.size() > 4) {
    status.SetError("SET must be called with two or three arguments.");
    return false;
  }

  if (args[1].empty()) {
    status.SetError("Invalid name for path variable.");
    return false;
  }

  static NormalizeParser const parser;

  const auto arguments = parser.Parse(args);

  if (parser.GetInputs().size() != 1) {
    status.SetError("SET called with unexpected arguments.");
    return false;
  }

  auto path =
    cmCMakePath(parser.GetInputs().front(), cmCMakePath::native_format);

  if (arguments.Normalize) {
    path = path.Normal();
  }

  status.GetMakefile().AddDefinition(args[1], path.GenericString());

  return true;
}